

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

void __thiscall cmDebugger_impl::ClearAllWatchpoints(cmDebugger_impl *this)

{
  cmWatchpoint *watch;
  pointer pcVar1;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> watchpoints;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> local_30;
  
  (*(this->super_cmDebugger)._vptr_cmDebugger[8])(&local_30,this);
  for (pcVar1 = local_30.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar1 != local_30.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>._M_impl.
                super__Vector_impl_data._M_finish; pcVar1 = pcVar1 + 1) {
    (*(this->super_cmDebugger)._vptr_cmDebugger[0x13])(this,pcVar1->Id);
  }
  std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::~vector(&local_30);
  return;
}

Assistant:

void ClearAllWatchpoints() override
  {
    auto watchpoints = GetWatchpoints();
    for (auto& watch : watchpoints) {
      ClearWatchpoint(watch.Id);
    }
  }